

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

node_le_t * __thiscall
tchecker::tck_reach::concur19::node_le_t::operator=(node_le_t *this,node_le_t *node_le)

{
  map_t *pmVar1;
  
  if (this != node_le) {
    std::__shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2> *)
               this,(__shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                     *)node_le);
    pmVar1 = node_le->_u;
    this->_l = node_le->_l;
    this->_u = pmVar1;
    node_le->_l = (map_t *)0x0;
    node_le->_u = (map_t *)0x0;
  }
  return this;
}

Assistant:

tchecker::tck_reach::concur19::node_le_t & node_le_t::operator=(tchecker::tck_reach::concur19::node_le_t && node_le)
{
  if (this != &node_le) {
    _clockbounds = std::move(node_le._clockbounds);
    _l = node_le._l;
    node_le._l = nullptr;
    _u = node_le._u;
    node_le._u = nullptr;
  }
  return *this;
}